

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O1

void SendPeerSetupMsg(WS_ReaderInfo reader,int reversePeer,int myRank)

{
  SstStream s;
  int iVar1;
  _PeerSetupMsg setup;
  void *local_28;
  int iStack_20;
  int iStack_1c;
  
  s = reader->ParentStream;
  local_28 = reader->Connections[reversePeer].RemoteStreamID;
  _iStack_20 = CONCAT44(s->CohortSize,myRank);
  iVar1 = CMwrite(reader->Connections[reversePeer].CMconn,s->CPInfo->SharedCM->PeerSetupFormat,
                  &local_28);
  if (iVar1 != 1) {
    CP_verbose(s,CriticalVerbose,
               "Message failed to send to reader peer rank %d in sendPeerSetup in reader open\n",
               reversePeer);
  }
  return;
}

Assistant:

static void SendPeerSetupMsg(WS_ReaderInfo reader, int reversePeer, int myRank)
{
    CMConnection conn = reader->Connections[reversePeer].CMconn;
    SstStream Stream = reader->ParentStream;
    struct _PeerSetupMsg setup;
    memset(&setup, 0, sizeof(setup));
    setup.RS_Stream = reader->Connections[reversePeer].RemoteStreamID;
    setup.WriterRank = myRank;
    setup.WriterCohortSize = Stream->CohortSize;
    STREAM_ASSERT_UNLOCKED(Stream);
    if (CMwrite(conn, Stream->CPInfo->SharedCM->PeerSetupFormat, &setup) != 1)
    {
        CP_verbose(Stream, CriticalVerbose,
                   "Message failed to send to reader peer rank %d in sendPeerSetup in "
                   "reader open\n",
                   reversePeer);
    }
}